

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intM114.c
# Opt level: O3

int Inter_ManPerformOneStep(Inter_Man_t *p,int fUseBias,int fUseBackward,abctime nTimeNewOut)

{
  int iVar1;
  int iVar2;
  sat_solver *s;
  int *__ptr;
  ulong uVar3;
  int *piVar4;
  Sto_Man_t *pCnf;
  Inta_Man_t *p_00;
  Aig_Man_t *pAVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  timespec ts;
  
  s = Inter_ManDeriveSatSolver
                (p->pInter,p->pCnfInter,p->pAigTrans,p->pCnfAig,p->pFrames,p->pCnfFrames,p->vVarsAB,
                 fUseBackward);
  if (s == (sat_solver *)0x0) {
    p->pInterNew = (Aig_Man_t *)0x0;
  }
  else {
    if (nTimeNewOut != 0) {
      s->nRuntimeLimit = nTimeNewOut;
    }
    iVar1 = sat_solver_nvars(s);
    __ptr = (int *)calloc((long)iVar1,4);
    uVar3 = (ulong)p->vVarsAB->nSize;
    if (0 < (long)uVar3) {
      piVar4 = p->vVarsAB->pArray;
      uVar6 = 0;
      do {
        __ptr[piVar4[uVar6]] = 1;
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar3);
    }
    piVar4 = (int *)0x0;
    if (fUseBias != 0) {
      piVar4 = __ptr;
    }
    s->pGlobalVars = piVar4;
    iVar1 = clock_gettime(3,(timespec *)&ts);
    if (iVar1 < 0) {
      lVar7 = 1;
    }
    else {
      lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
      lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + ts.tv_sec * -1000000;
    }
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,(long)p->nConfLimit,0,0,0);
    p->nConfCur = (int)(s->stats).conflicts;
    iVar2 = clock_gettime(3,(timespec *)&ts);
    if (iVar2 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    p->timeSat = p->timeSat + lVar8 + lVar7;
    s->pGlobalVars = (int *)0x0;
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (iVar1 != -1) {
      iVar2 = 0;
      if (iVar1 != 1) {
        iVar2 = -1;
      }
      sat_solver_delete(s);
      return iVar2;
    }
    pCnf = (Sto_Man_t *)sat_solver_store_release(s);
    sat_solver_delete(s);
    if (pCnf != (Sto_Man_t *)0x0) {
      iVar1 = clock_gettime(3,(timespec *)&ts);
      if (iVar1 < 0) {
        lVar7 = 1;
      }
      else {
        lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      p_00 = Inta_ManAlloc();
      pAVar5 = (Aig_Man_t *)Inta_ManInterpolate(p_00,pCnf,nTimeNewOut,p->vVarsAB,0);
      p->pInterNew = pAVar5;
      Inta_ManFree(p_00);
      iVar1 = clock_gettime(3,(timespec *)&ts);
      if (iVar1 < 0) {
        lVar8 = -1;
      }
      else {
        lVar8 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      p->timeInt = p->timeInt + lVar8 + lVar7;
      Sto_ManFree(pCnf);
      return -(uint)(p->pInterNew == (Aig_Man_t *)0x0) | 1;
    }
  }
  return 1;
}

Assistant:

int Inter_ManPerformOneStep( Inter_Man_t * p, int fUseBias, int fUseBackward, abctime nTimeNewOut )
{
    sat_solver * pSat;
    void * pSatCnf = NULL;
    Inta_Man_t * pManInterA; 
//    Intb_Man_t * pManInterB; 
    int * pGlobalVars;
    int status, RetValue;
    int i, Var;
    abctime clk;
//    assert( p->pInterNew == NULL );

    // derive the SAT solver
    pSat = Inter_ManDeriveSatSolver( p->pInter, p->pCnfInter, p->pAigTrans, p->pCnfAig, p->pFrames, p->pCnfFrames, p->vVarsAB, fUseBackward );
    if ( pSat == NULL )
    {
        p->pInterNew = NULL;
        return 1;
    }

    // set runtime limit
    if ( nTimeNewOut )
        sat_solver_set_runtime_limit( pSat, nTimeNewOut );

    // collect global variables
    pGlobalVars = ABC_CALLOC( int, sat_solver_nvars(pSat) );
    Vec_IntForEachEntry( p->vVarsAB, Var, i )
        pGlobalVars[Var] = 1;
    pSat->pGlobalVars = fUseBias? pGlobalVars : NULL;

    // solve the problem
clk = Abc_Clock();
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)p->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    p->nConfCur = pSat->stats.conflicts;
p->timeSat += Abc_Clock() - clk;

    pSat->pGlobalVars = NULL;
    ABC_FREE( pGlobalVars );
    if ( status == l_False )
    {
        pSatCnf = sat_solver_store_release( pSat );
        RetValue = 1;
    }
    else if ( status == l_True )
    {
        RetValue = 0;
    } 
    else
    {
        RetValue = -1;
    }
    sat_solver_delete( pSat );
    if ( pSatCnf == NULL )
        return RetValue;

    // create the resulting manager
clk = Abc_Clock();
/*
    if ( !fUseIp )
    {
        pManInterA = Inta_ManAlloc();
        p->pInterNew = Inta_ManInterpolate( pManInterA, pSatCnf, p->vVarsAB, 0 );
        Inta_ManFree( pManInterA );
    }
    else
    {
        Aig_Man_t * pInterNew2;
        int RetValue;

        pManInterA = Inta_ManAlloc();
        p->pInterNew = Inta_ManInterpolate( pManInterA, pSatCnf, p->vVarsAB, 0 );
//        Inter_ManVerifyInterpolant1( pManInterA, pSatCnf, p->pInterNew );
        Inta_ManFree( pManInterA );

        pManInterB = Intb_ManAlloc();
        pInterNew2 = Intb_ManInterpolate( pManInterB, pSatCnf, p->vVarsAB, 0 );
        Inter_ManVerifyInterpolant2( pManInterB, pSatCnf, pInterNew2 );
        Intb_ManFree( pManInterB );

        // check relationship
        RetValue = Inter_ManCheckEquivalence( pInterNew2, p->pInterNew );
        if ( RetValue )
            printf( "Equivalence \"Ip == Im\" holds\n" );
        else
        {
//            printf( "Equivalence \"Ip == Im\" does not hold\n" );
            RetValue = Inter_ManCheckContainment( pInterNew2, p->pInterNew );
            if ( RetValue )
                printf( "Containment \"Ip -> Im\" holds\n" );
            else
                printf( "Containment \"Ip -> Im\" does not hold\n" );

            RetValue = Inter_ManCheckContainment( p->pInterNew, pInterNew2 );
            if ( RetValue )
                printf( "Containment \"Im -> Ip\" holds\n" );
            else
                printf( "Containment \"Im -> Ip\" does not hold\n" );
        }

        Aig_ManStop( pInterNew2 );
    }
*/

    pManInterA = Inta_ManAlloc();
    p->pInterNew = (Aig_Man_t *)Inta_ManInterpolate( pManInterA, (Sto_Man_t *)pSatCnf, nTimeNewOut, p->vVarsAB, 0 );
    Inta_ManFree( pManInterA );

p->timeInt += Abc_Clock() - clk;
    Sto_ManFree( (Sto_Man_t *)pSatCnf );
    if ( p->pInterNew == NULL )
        RetValue = -1;
    return RetValue;
}